

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15bad7::EqualizerState::process
          (EqualizerState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  FloatBufferLine *dst;
  span<std::array<float,_1024UL>,_18446744073709551615UL> sVar1;
  pointer paVar2;
  BiquadFilterR<float> *pBVar3;
  iterator __begin1;
  float *pfVar4;
  span<const_float,_18446744073709551615UL> src;
  span<const_float,_18446744073709551615UL> src_00;
  span<const_float,_18446744073709551615UL> sVar5;
  DualBiquadR<float> local_60;
  long local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_38 = samplesIn.mDataEnd;
  local_40 = samplesOut.mDataEnd;
  local_48 = samplesOut.mData;
  dst = &this->mSampleBuffer;
  pfVar4 = (this->mSampleBuffer)._M_elems + samplesToDo;
  pBVar3 = this->mChans[0].filter;
  local_50 = samplesToDo * 4;
  for (paVar2 = samplesIn.mData; paVar2 != local_38; paVar2 = paVar2 + 1) {
    local_60.f1 = pBVar3 + 1;
    src.mDataEnd = (pointer)((long)paVar2->_M_elems + local_50);
    src.mData = paVar2->_M_elems;
    local_60.f0 = pBVar3;
    DualBiquadR<float>::process(&local_60,src,dst->_M_elems);
    local_60.f0 = pBVar3 + 2;
    local_60.f1 = pBVar3 + 3;
    src_00.mDataEnd = pfVar4;
    src_00.mData = dst->_M_elems;
    DualBiquadR<float>::process(&local_60,src_00,dst->_M_elems);
    sVar1.mDataEnd = local_40;
    sVar1.mData = local_48;
    sVar5.mDataEnd = pfVar4;
    sVar5.mData = dst->_M_elems;
    (*MixSamples)(sVar5,sVar1,&pBVar3[4].mZ1,&pBVar3[6].mB0,samplesToDo,0);
    pBVar3 = (BiquadFilterR<float> *)&pBVar3[8].mB2;
  }
  return;
}

Assistant:

void EqualizerState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    const al::span<float> buffer{mSampleBuffer.data(), samplesToDo};
    auto chan = std::addressof(mChans[0]);
    for(const auto &input : samplesIn)
    {
        const al::span<const float> inbuf{input.data(), samplesToDo};
        DualBiquad{chan->filter[0], chan->filter[1]}.process(inbuf, buffer.begin());
        DualBiquad{chan->filter[2], chan->filter[3]}.process(buffer, buffer.begin());

        MixSamples(buffer, samplesOut, chan->CurrentGains, chan->TargetGains, samplesToDo, 0u);
        ++chan;
    }
}